

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

bool CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_Parse
               (ConstStringParam name,VisionFeaturePrint_Objects_ObjectsVersion *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)VisionFeaturePrint_Objects_ObjectsVersion_entries,2,local_20,
                     &int_value);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool VisionFeaturePrint_Objects_ObjectsVersion_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, VisionFeaturePrint_Objects_ObjectsVersion* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      VisionFeaturePrint_Objects_ObjectsVersion_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<VisionFeaturePrint_Objects_ObjectsVersion>(int_value);
  }
  return success;
}